

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_convolve_2d_sr_intrabc_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  undefined1 *puVar7;
  int iVar8;
  undefined1 *puVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  undefined1 local_8b38 [35592];
  
  uVar11 = (ulong)(uint)w;
  bVar4 = (byte)conv_params->round_0;
  if (-1 < h) {
    puVar9 = local_8b38;
    iVar8 = 0;
    do {
      if (0 < w) {
        uVar10 = 0;
        do {
          *(short *)(puVar9 + uVar10 * 2) =
               (short)((int)(((uint)src[uVar10 + 1] + (uint)src[uVar10]) * 0x40 +
                            ((1 << (bVar4 & 0x1f)) >> 1) + (1 << ((char)bd + 6U & 0x1f))) >>
                      (bVar4 & 0x1f));
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      puVar9 = puVar9 + (long)w * 2;
      src = src + src_stride;
      bVar12 = iVar8 != h;
      iVar8 = iVar8 + 1;
    } while (bVar12);
  }
  if (0 < h) {
    bVar2 = (byte)conv_params->round_1;
    bVar3 = ('\x0e' - bVar4) - bVar2;
    bVar4 = ((char)bd - bVar4) + 0xe;
    bVar5 = bVar4 - bVar2;
    puVar7 = local_8b38 + uVar11 * 2;
    lVar1 = (long)w * 2;
    iVar8 = 0;
    puVar9 = local_8b38;
    do {
      if (0 < w) {
        uVar10 = 0;
        do {
          iVar6 = (((int)*(short *)(puVar7 + uVar10 * 2) + (int)*(short *)(puVar9 + uVar10 * 2)) *
                   0x40 + ((1 << (bVar2 & 0x1f)) >> 1) + (1 << (bVar4 & 0x1f)) >> (bVar2 & 0x1f)) +
                  ((1 << (bVar3 & 0x1f)) >> 1) + (-1 << (bVar5 & 0x1f)) + (-1 << (bVar5 - 1 & 0x1f))
                  >> (bVar3 & 0x1f);
          if (bd == 10) {
            if (0x3fe < iVar6) {
              iVar6 = 0x3ff;
            }
          }
          else if (bd == 0xc) {
            if (0xffe < iVar6) {
              iVar6 = 0xfff;
            }
          }
          else if (0xfe < iVar6) {
            iVar6 = 0xff;
          }
          if (iVar6 < 1) {
            iVar6 = 0;
          }
          dst[uVar10] = (uint16_t)iVar6;
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      iVar8 = iVar8 + 1;
      puVar7 = puVar7 + lVar1;
      dst = dst + dst_stride;
      puVar9 = puVar9 + lVar1;
    } while (iVar8 != h);
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_intrabc_c(
    const uint16_t *src, int src_stride, uint16_t *dst, int dst_stride, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params, int bd) {
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  assert(subpel_x_qn == 8);
  assert(subpel_y_qn == 8);
  assert(filter_params_x->taps == 2 && filter_params_y->taps == 2);
  assert((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS);
  (void)filter_params_x;
  (void)subpel_x_qn;
  (void)filter_params_y;
  (void)subpel_y_qn;
  (void)conv_params;

  int16_t im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE];
  int im_h = h + 1;
  int im_stride = w;
  assert(w <= MAX_SB_SIZE && h <= MAX_SB_SIZE);

  // horizontal filter
  // explicitly operate for subpel_x_qn = 8.
  int16_t *im = im_block;
  for (int y = 0; y < im_h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t sum = (1 << (bd + FILTER_BITS - 1)) + 64 * (src[x] + src[x + 1]);
      assert(0 <= sum && sum < (1 << (bd + FILTER_BITS + 1)));
      sum = ROUND_POWER_OF_TWO(sum, conv_params->round_0);
      im[x] = sum;
    }
    src += src_stride;
    im += im_stride;
  }

  // vertical filter
  // explicitly operate for subpel_y_qn = 8.
  int16_t *src_vert = im_block;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      const int32_t sum =
          (1 << offset_bits) + 64 * (src_vert[x] + src_vert[im_stride + x]);
      assert(0 <= sum && sum < (1 << (offset_bits + 2)));
      const int32_t res = ROUND_POWER_OF_TWO(sum, conv_params->round_1) -
                          ((1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1)));

      dst[x] = clip_pixel_highbd(ROUND_POWER_OF_TWO(res, bits), bd);
    }
    src_vert += im_stride;
    dst += dst_stride;
  }
}